

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

void __thiscall
rudp::session_config::session_config(session_config *this,uint8_t *begin,uint8_t *end)

{
  difference_type dVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  uint8_t *iter;
  uint8_t *end_local;
  uint8_t *begin_local;
  session_config *this_local;
  
  dVar1 = std::distance<unsigned_char_const*>(begin,end);
  if (dVar1 != 0x16) {
    uVar2 = __cxa_allocate_exception(1);
    __cxa_throw(uVar2,&unable_to_deserialize_session_config::typeinfo,0);
  }
  if (*begin != '\x10') {
    uVar2 = __cxa_allocate_exception(1);
    __cxa_throw(uVar2,&invalid_packet::typeinfo,0);
  }
  this->max_out_of_standing_segs = begin[1];
  this->option_flags = begin[2];
  puVar3 = from_be16(begin + 4,&this->maximum_segment_size);
  puVar3 = from_be16(puVar3,&this->retransmission_timeout_value);
  puVar3 = from_be16(puVar3,&this->cumulative_ack_timeout_value);
  puVar3 = from_be16(puVar3,&this->null_segment_timeout_value);
  puVar3 = from_be16(puVar3,&this->transfer_state_timeout_value);
  this->max_retrans = *puVar3;
  this->max_cum_ack = puVar3[1];
  this->max_out_of_seq = puVar3[2];
  this->max_auto_reset = puVar3[3];
  from_be32(puVar3 + 4,&this->connection_identifier);
  return;
}

Assistant:

session_config::session_config( const uint8_t *begin, const uint8_t *end ) {
  if( std::distance( begin, end ) != 22 ) throw unable_to_deserialize_session_config();
  auto iter = begin;
  if( *( iter++ ) != 0x10 ) throw invalid_packet();
  max_out_of_standing_segs = *( iter++ );
  option_flags = *( iter++ );
  ++iter;
  iter = from_be16( iter, maximum_segment_size );
  iter = from_be16( iter, retransmission_timeout_value );
  iter = from_be16( iter, cumulative_ack_timeout_value );
  iter = from_be16( iter, null_segment_timeout_value );
  iter = from_be16( iter, transfer_state_timeout_value );
  max_retrans = *( iter++ );
  max_cum_ack = *( iter++ );
  max_out_of_seq = *( iter++ );
  max_auto_reset = *( iter++ );
  iter = from_be32( iter, connection_identifier );
}